

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_void>::load
          (type_caster<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  handle hVar3;
  npy_api *pnVar4;
  undefined7 in_register_00000011;
  PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *this_00;
  array buf;
  array ref;
  EigenConformable<true> fits;
  array local_88;
  array local_80;
  PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> local_78;
  EigenConformable<true> local_50;
  
  if (((int)CONCAT71(in_register_00000011,convert) == 0) &&
     (bVar1 = array_t<double,_16>::check_(src), !bVar1)) {
    return false;
  }
  bVar1 = false;
  array::ensure(&local_80,src,0);
  if (local_80.super_buffer.super_object.super_handle.m_ptr == (object)0x0) goto LAB_001fdd87;
  iVar2 = *(int *)((long)local_80.super_buffer.super_object.super_handle.m_ptr + 0x18);
  if (((long)iVar2 - 3U < 0xfffffffffffffffe) ||
     (EigenProps<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::conformable(&local_50,&local_80),
     local_50.conformable == false)) {
    bVar1 = false;
    goto LAB_001fdd87;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::resize
            (&local_78,local_50.rows,local_50.cols);
  Eigen::Matrix<double,_1,_5,_1,_1,_5>::operator=
            (&this->value,(Matrix<double,_1,_5,_1,_1,_5> *)&local_78);
  local_88.super_buffer.super_object.super_handle.m_ptr = (buffer)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar3 = eigen_ref_array<pybind11::detail::EigenProps<Eigen::Matrix<double,1,5,1,1,5>>,Eigen::Matrix<double,1,5,1,1,5>>
                    (&this->value,(PyObject *)&_Py_NoneStruct);
  local_78.m_storage.m_data.array[0] = (double)hVar3;
  pybind11::object::~object((object *)&local_88);
  if (iVar2 == 1) {
    array::squeeze(&local_88);
    this_00 = &local_78;
LAB_001fdd4b:
    pybind11::object::operator=((object *)this_00,(object *)&local_88);
    pybind11::object::~object((object *)&local_88);
  }
  else if (*(int *)&hVar3.m_ptr[1].ob_type == 1) {
    array::squeeze(&local_88);
    this_00 = (PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_> *)&local_80;
    goto LAB_001fdd4b;
  }
  pnVar4 = npy_api::get();
  iVar2 = (*pnVar4->PyArray_CopyInto_)
                    ((PyObject *)local_78.m_storage.m_data.array[0],
                     (PyObject *)local_80.super_buffer.super_object.super_handle.m_ptr);
  bVar1 = -1 < iVar2;
  if (!bVar1) {
    PyErr_Clear();
  }
  pybind11::object::~object((object *)&local_78);
LAB_001fdd87:
  pybind11::object::~object((object *)&local_80);
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        // If we're in no-convert mode, only load if given an array of the correct type
        if (!convert && !isinstance<array_t<Scalar>>(src))
            return false;

        // Coerce into an array, but don't do type conversion yet; the copy below handles it.
        auto buf = array::ensure(src);

        if (!buf)
            return false;

        auto dims = buf.ndim();
        if (dims < 1 || dims > 2)
            return false;

        auto fits = props::conformable(buf);
        if (!fits)
            return false;

        // Allocate the new type, then build a numpy reference into it
        value = Type(fits.rows, fits.cols);
        auto ref = reinterpret_steal<array>(eigen_ref_array<props>(value));
        if (dims == 1) ref = ref.squeeze();
        else if (ref.ndim() == 1) buf = buf.squeeze();

        int result = detail::npy_api::get().PyArray_CopyInto_(ref.ptr(), buf.ptr());

        if (result < 0) { // Copy failed!
            PyErr_Clear();
            return false;
        }

        return true;
    }